

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_crypt_fuzzer.cc
# Opt level: O2

shared_ptr<QPDF> __thiscall FuzzHelper::getQpdf(FuzzHelper *this)

{
  _Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_> this_00;
  BufferInputSource *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Buffer *in_RSI;
  shared_ptr<QPDF> sVar1;
  shared_ptr<InputSource> is;
  allocator<char> local_61;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  this_01 = (BufferInputSource *)operator_new(0xe8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"fuzz input",&local_61);
  BufferInputSource::BufferInputSource(this_01,&local_40,in_RSI,false);
  std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BufferInputSource,void>
            ((__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> *)&local_60,this_01);
  std::__cxx11::string::~string((string *)&local_40);
  QPDF::create();
  QPDF::setMaxWarnings
            ((QPDF *)(this->input_buffer).m._M_t.
                     super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
                     .super__Head_base<0UL,_Buffer::Members_*,_false>,200);
  this_00.super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (this->input_buffer).m._M_t.
       super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
       super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
       super__Head_base<0UL,_Buffer::Members_*,_false>;
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,&local_60);
  QPDF::processInputSource
            ((QPDF *)this_00.super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl,
             (shared_ptr<InputSource> *)&local_50,(char *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  sVar1.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDF>)sVar1.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDF>
FuzzHelper::getQpdf()
{
    auto is =
        std::shared_ptr<InputSource>(new BufferInputSource("fuzz input", &this->input_buffer));
    auto qpdf = QPDF::create();
    qpdf->setMaxWarnings(200);
    qpdf->processInputSource(is);
    return qpdf;
}